

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Results-ANN-IRIS-Training.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  result_type rVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  Scalar *pSVar6;
  ostream *poVar7;
  int i;
  long lVar8;
  double dVar9;
  double dVar10;
  Index local_4e0;
  double local_4d8;
  string line;
  default_random_engine generator;
  MatrixXd y;
  MatrixXd X;
  uniform_int_distribution<int> distribution;
  MatrixXd batch_X;
  DenseStorage<double,__1,__1,__1,_0> local_430;
  DenseStorage<double,__1,__1,__1,_0> local_418;
  DenseStorage<double,__1,__1,__1,_0> local_400;
  MatrixXd accuracy;
  MatrixXd validate_y;
  MatrixXd validate_X;
  MatrixXd batch_y;
  string delimiter;
  ANN n;
  DenseStorage<double,__1,__1,__1,_0> local_310;
  DenseStorage<double,__1,__1,__1,_0> local_2f8;
  DenseStorage<double,__1,__1,__1,_0> local_2e0;
  DenseStorage<double,__1,__1,__1,_0> local_2c8;
  DenseStorage<double,__1,__1,__1,_0> local_2b0;
  string local_298;
  string local_278;
  string local_258;
  ifstream file;
  
  ANN::ANN(&n);
  ANN::setInputSize(&n,4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"tanh",(allocator<char> *)&file);
  ANN::addLayer(&n,0x32,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"tanh",(allocator<char> *)&file);
  ANN::addLayer(&n,0x32,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"sigmoid",(allocator<char> *)&file);
  ANN::addLayer(&n,3,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::ifstream::ifstream(&file,"/home/haukur/MasterProject/Plotting/iris.csv",_S_in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&delimiter,",",(allocator<char> *)&line);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)&line,0x96,4);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&X,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&line);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)&line,0x96,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&y,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&line);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    local_4e0 = 0;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&file,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      lVar8 = -1;
      while( true ) {
        lVar5 = std::__cxx11::string::find((string *)&line,(ulong)&delimiter);
        if (lVar5 == -1) break;
        std::__cxx11::string::substr((ulong)&accuracy,(ulong)&line);
        dVar9 = std::__cxx11::stod((string *)&accuracy,(size_t *)0x0);
        std::__cxx11::string::~string((string *)&accuracy);
        if (lVar8 + 1 == 0) {
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&y,
                              local_4e0,(long)(int)dVar9);
          *pSVar6 = 1.0;
        }
        else {
          std::__cxx11::string::substr((ulong)&accuracy,(ulong)&line);
          dVar9 = std::__cxx11::stod((string *)&accuracy,(size_t *)0x0);
          std::__cxx11::string::substr((ulong)&batch_X,(ulong)&line);
          dVar10 = std::__cxx11::stod((string *)&batch_X,(size_t *)0x0);
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&X,
                              local_4e0,lVar8);
          *pSVar6 = dVar9 + dVar10 / 10.0;
          std::__cxx11::string::~string((string *)&batch_X);
          std::__cxx11::string::~string((string *)&accuracy);
        }
        std::__cxx11::string::erase((ulong)&line,0);
        lVar8 = lVar8 + 1;
      }
      local_4e0 = local_4e0 + 1;
    }
    std::__cxx11::string::~string((string *)&line);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)&line,0x14,4);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&batch_X,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&line);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)&line,0x14,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&batch_y,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&line);
  generator._M_x = 1;
  distribution._M_param._M_a = 0;
  distribution._M_param._M_b = 0x77;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_30,_4,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false> *)&line,&X,0x78,0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,30,4,false>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&validate_X,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_> *)
             &line);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_30,_3,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_3,_false> *)&line,&y,0x78,0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,30,3,false>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&validate_y,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_3,_false>_> *)
             &line);
  local_4d8 = 0.1;
  for (iVar3 = 0; iVar3 != 1000; iVar3 = iVar3 + 1) {
    for (lVar8 = 0; lVar8 != 0x14; lVar8 = lVar8 + 1) {
      rVar2 = std::uniform_int_distribution<int>::operator()(&distribution,&generator);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_4,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> *)&line,&X,
                 (long)rVar2,0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_4,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> *)&accuracy,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&batch_X,lVar8,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,4,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,4,false>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> *)&accuracy,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> *)&line);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)&line,&y,
                 (long)rVar2,0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)&accuracy,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&batch_y,lVar8,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,3,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,3,false>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)&accuracy,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)&line);
    }
    ANN::setLearningRate(&n,local_4d8);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_400,(DenseStorage<double,__1,__1,__1,_0> *)&batch_X);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_2b0,(DenseStorage<double,__1,__1,__1,_0> *)&batch_y);
    ANN::fit(&n,(MatrixXd *)&local_400,(MatrixXd *)&local_2b0);
    free(local_2b0.m_data);
    free(local_400.m_data);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_2c8,(DenseStorage<double,__1,__1,__1,_0> *)&validate_X);
    ANN::predict((MatrixXd *)&line,&n,(MatrixXd *)&local_2c8);
    free(local_2c8.m_data);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_2e0,(DenseStorage<double,__1,__1,__1,_0> *)&batch_X);
    ANN::predict(&accuracy,&n,(MatrixXd *)&local_2e0);
    free(local_2e0.m_data);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::operator<<(poVar7,",");
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_418,(DenseStorage<double,__1,__1,__1,_0> *)&accuracy);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_2f8,(DenseStorage<double,__1,__1,__1,_0> *)&batch_y);
    dVar9 = comparePrediction((MatrixXd *)&local_418,(MatrixXd *)&local_2f8);
    poVar7 = std::ostream::_M_insert<double>(dVar9);
    std::operator<<(poVar7,",");
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_430,(DenseStorage<double,__1,__1,__1,_0> *)&line);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_310,(DenseStorage<double,__1,__1,__1,_0> *)&validate_y);
    dVar9 = comparePrediction((MatrixXd *)&local_430,(MatrixXd *)&local_310);
    poVar7 = std::ostream::_M_insert<double>(dVar9);
    std::endl<char,std::char_traits<char>>(poVar7);
    free(local_310.m_data);
    free(local_430.m_data);
    free(local_2f8.m_data);
    free(local_418.m_data);
    free(accuracy.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(line._M_dataplus._M_p);
    local_4d8 = (double)(~-(ulong)(0.01 < local_4d8) & (ulong)local_4d8 |
                        (ulong)(local_4d8 * 0.99) & -(ulong)(0.01 < local_4d8));
  }
  free(validate_y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
  ;
  free(validate_X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
  ;
  free(batch_y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(batch_X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  std::__cxx11::string::~string((string *)&delimiter);
  std::ifstream::~ifstream(&file);
  ANN::~ANN(&n);
  return 0;
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setInputSize(4);
    n.addLayer(50, "tanh");
    n.addLayer(50, "tanh");
    n.addLayer(3, "sigmoid");

    ifstream file("/home/haukur/MasterProject/Plotting/iris.csv");
    string delimiter = ",";

    Eigen::MatrixXd X = Eigen::MatrixXd::Zero(150, 4);
    Eigen::MatrixXd y = Eigen::MatrixXd::Zero(150, 3);

    if(file.is_open()) {
        string line;
        int line_index = 0;
        while(getline(file, line)) {
            size_t pos = 0;
            int token;
            int index = -1;
            while ((pos = line.find(delimiter)) != std::string::npos) {
                token = stod(line.substr(0, pos));
                if(index == -1) {
                    y(line_index, token) = 1;
                }
                else {
                    X(line_index, index) = stod(line.substr(0, 1)) + stod(line.substr(2, 1))/10;
                }
                line.erase(0, pos + delimiter.length());
                index++;
            }
            line_index++;
        }
    }

    int batch_size = 20;

    Eigen::MatrixXd batch_X = Eigen::MatrixXd::Zero(batch_size, 4);
    Eigen::MatrixXd batch_y = Eigen::MatrixXd::Zero(batch_size, 3);

    std::default_random_engine generator;
    std::uniform_int_distribution<int> distribution(0,119);
    
    double learning_rate = 0.1;

    Eigen::MatrixXd validate_X = X.block<30,4>(120,0);
    Eigen::MatrixXd validate_y = y.block<30,3>(120,0);

    for(int i = 0; i < 1000; i++) {
        for(int i = 0; i < batch_size; i++) {
            int pick = distribution(generator);
            batch_X.block<1,4>(i, 0) = X.block<1,4>(pick, 0);
            batch_y.block<1,3>(i,0) = y.block<1,3>(pick, 0);
        }
        n.setLearningRate(learning_rate);
        n.fit(batch_X, batch_y);
        if(i % 1 == 0) {
            Eigen::MatrixXd prediction = n.predict(validate_X);
            Eigen::MatrixXd accuracy = n.predict(batch_X);
            cout << i << "," << comparePrediction(accuracy, batch_y) << "," << comparePrediction(prediction, validate_y) << endl;
            // Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            // cout << "Epoch: " << i << " MSE: " << se.mean() << " learning rate: " << learning_rate << endl;
        }
        if(learning_rate > 0.01)
            learning_rate *= 0.99;
    }
    
    return 0;
}